

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_NtkFindMffcSize(Acb_Ntk_t *p,Vec_Int_t *vObjsRefed,Vec_Int_t *vObjsDerefed,int *nGates)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *vRefs;
  int *__s;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = (p->vObjType).nSize;
  vRefs = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  vRefs->nSize = 0;
  vRefs->nCap = iVar8;
  if (iVar8 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar8 << 2);
  }
  vRefs->pArray = __s;
  vRefs->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  uVar5 = (ulong)(p->vObjType).nSize;
  if (1 < (long)uVar5) {
    uVar2 = (p->vObjType).nSize;
    uVar6 = 1;
    if (1 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    uVar7 = 1;
    do {
      if (uVar7 == uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((p->vObjType).pArray[uVar7] != '\0') {
        if ((long)(p->vObjFans).nSize <= (long)uVar7) goto LAB_003a9c61;
        iVar8 = (p->vObjFans).pArray[uVar7];
        lVar9 = (long)iVar8;
        if ((lVar9 < 0) || ((p->vFanSto).nSize <= iVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar3 = (p->vFanSto).pArray;
        if (0 < piVar3[lVar9]) {
          lVar10 = 0;
          do {
            iVar8 = piVar3[lVar9 + lVar10 + 1];
            if (((long)iVar8 < 0) || (iVar1 <= iVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            __s[iVar8] = __s[iVar8] + 1;
            lVar10 = lVar10 + 1;
          } while (lVar10 < piVar3[lVar9]);
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  if (0 < vObjsRefed->nSize) {
    lVar9 = 0;
    do {
      Acb_NtkNodeRef_rec(vRefs,p,vObjsRefed->pArray[lVar9],(int *)0x0);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vObjsRefed->nSize);
  }
  if (vObjsDerefed->nSize < 1) {
    iVar8 = 0;
  }
  else {
    lVar9 = 0;
    iVar8 = 0;
    do {
      iVar4 = vObjsDerefed->pArray[lVar9];
      if (((long)iVar4 < 0) || (iVar1 <= iVar4)) {
LAB_003a9c61:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (__s[iVar4] == 0) {
        iVar4 = Acb_NtkNodeRef_rec(vRefs,p,iVar4,nGates);
        iVar8 = iVar8 + iVar4;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vObjsDerefed->nSize);
  }
  if (__s != (int *)0x0) {
    free(__s);
    vRefs->pArray = (int *)0x0;
  }
  free(vRefs);
  return iVar8;
}

Assistant:

int Acb_NtkFindMffcSize( Acb_Ntk_t * p, Vec_Int_t * vObjsRefed, Vec_Int_t * vObjsDerefed, int nGates[5] )
{
    Vec_Int_t * vRefs = Vec_IntStart( Acb_NtkObjNumMax(p) );
    int i, iObj, Fanin, * pFanins, Count2 = 0;
    Acb_NtkForEachObj( p, iObj )
        Acb_ObjForEachFaninFast( p, iObj, pFanins, Fanin, i )
            Vec_IntAddToEntry( vRefs, Fanin, 1 );
    Vec_IntForEachEntry( vObjsRefed, iObj, i )
        Acb_NtkNodeRef_rec( vRefs, p, iObj, NULL );
    Vec_IntForEachEntry( vObjsDerefed, iObj, i )
        if ( Vec_IntEntry(vRefs, iObj) == 0 )
            Count2 += Acb_NtkNodeRef_rec( vRefs, p, iObj, nGates );
    Vec_IntFree( vRefs );
    return Count2;
}